

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O2

void __thiscall QDirPrivate::QDirPrivate(QDirPrivate *this,QDirPrivate *copy)

{
  qint64 qVar1;
  qint64 qVar2;
  qint64 qVar3;
  qint64 qVar4;
  qint64 qVar5;
  MetaDataFlags MVar6;
  uint uVar7;
  
  (this->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 0;
  QArrayDataPointer<QString>::QArrayDataPointer(&(this->nameFilters).d,&(copy->nameFilters).d);
  (this->sort).super_QFlagsStorageHelper<QDir::SortFlag,_4>.super_QFlagsStorage<QDir::SortFlag>.i =
       (copy->sort).super_QFlagsStorageHelper<QDir::SortFlag,_4>.super_QFlagsStorage<QDir::SortFlag>
       .i;
  (this->filters).super_QFlagsStorageHelper<QDir::Filter,_4>.super_QFlagsStorage<QDir::Filter>.i =
       (copy->filters).super_QFlagsStorageHelper<QDir::Filter,_4>.super_QFlagsStorage<QDir::Filter>.
       i;
  (this->fileEngine)._M_t.
  super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>._M_t.
  super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
  super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl = (QAbstractFileEngine *)0x0;
  QFileSystemEntry::QFileSystemEntry(&this->dirEntry,&copy->dirEntry);
  FileCache::FileCache(&this->fileCache);
  LOCK();
  (this->fileCache).fileListsInitialized._M_base._M_i =
       (__int_type_conflict2)((copy->fileCache).fileListsInitialized._M_base._M_i & 1);
  UNLOCK();
  QArrayDataPointer<QString>::operator=(&(this->fileCache).files.d,&(copy->fileCache).files.d);
  QArrayDataPointer<QFileInfo>::operator=
            (&(this->fileCache).fileInfos.d,&(copy->fileCache).fileInfos.d);
  QFileSystemEntry::operator=
            (&(this->fileCache).absoluteDirEntry,&(copy->fileCache).absoluteDirEntry);
  MVar6.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
  super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
       (copy->fileCache).metaData.entryFlags.
       super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>;
  qVar1 = (copy->fileCache).metaData.size_;
  qVar2 = (copy->fileCache).metaData.accessTime_;
  qVar3 = (copy->fileCache).metaData.birthTime_;
  qVar4 = (copy->fileCache).metaData.metadataChangeTime_;
  qVar5 = (copy->fileCache).metaData.modificationTime_;
  (this->fileCache).metaData.knownFlagsMask =
       (QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>)
       (copy->fileCache).metaData.knownFlagsMask.
       super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>;
  (this->fileCache).metaData.entryFlags =
       (MetaDataFlags)
       MVar6.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
       super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i;
  (this->fileCache).metaData.size_ = qVar1;
  (this->fileCache).metaData.accessTime_ = qVar2;
  (this->fileCache).metaData.birthTime_ = qVar3;
  (this->fileCache).metaData.metadataChangeTime_ = qVar4;
  (this->fileCache).metaData.modificationTime_ = qVar5;
  uVar7 = (copy->fileCache).metaData.groupId_;
  (this->fileCache).metaData.userId_ = (copy->fileCache).metaData.userId_;
  (this->fileCache).metaData.groupId_ = uVar7;
  return;
}

Assistant:

QDirPrivate::QDirPrivate(const QDirPrivate &copy)
    : QSharedData(copy),
      // mutex is not copied
      nameFilters(copy.nameFilters),
      sort(copy.sort),
      filters(copy.filters),
      // fileEngine is not copied
      dirEntry(copy.dirEntry)
{
    QMutexLocker locker(&copy.fileCache.mutex);
    fileCache.fileListsInitialized = copy.fileCache.fileListsInitialized.load();
    fileCache.files = copy.fileCache.files;
    fileCache.fileInfos = copy.fileCache.fileInfos;
    fileCache.absoluteDirEntry = copy.fileCache.absoluteDirEntry;
    fileCache.metaData = copy.fileCache.metaData;
}